

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

SmallBuffer * helics::ValueConverter<double>::convert(double *val)

{
  SmallBuffer *in_RDI;
  SmallBuffer *dv;
  SmallBuffer *val_00;
  
  val_00 = in_RDI;
  SmallBuffer::SmallBuffer(in_RDI);
  convert((double *)val_00,in_RDI);
  return in_RDI;
}

Assistant:

static SmallBuffer convert(const X& val)
    {
        auto dv = SmallBuffer();
        convert(val, dv);
        return dv;
    }